

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O3

void __thiscall hmi::renderer::renderer(renderer *this,SDL_Window *window)

{
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aVar1;
  int iVar2;
  GLuint GVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aVar7;
  GLint link_status;
  GLint info_log_length;
  GLint local_38;
  int aiStack_34 [2];
  int local_2c;
  
  this->m_window = window;
  this->m_context = (void *)0x0;
  this->m_program = 0;
  pvVar4 = (void *)SDL_GL_CreateContext(window);
  this->m_context = pvVar4;
  if (pvVar4 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create a context: ",0x1c);
    pcVar5 = (char *)SDL_GetError();
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1121d0);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    return;
  }
  iVar2 = SDL_GL_MakeCurrent(this->m_window,pvVar4);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to make the context current: ",0x24);
    pcVar5 = (char *)SDL_GetError();
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1121d0);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  iVar2 = gladLoadGLES2Loader(SDL_GL_GetProcAddress);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to load GLES2",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendEquationSeparate)(0x8006,0x8006);
  (*glad_glBlendFuncSeparate)(0x302,0x303,1,0x303);
  SDL_GL_GetDrawableSize(this->m_window,&local_38,aiStack_34);
  aVar7.data[1] = (float)aiStack_34[0];
  aVar7.data[0] = (float)local_38;
  (this->m_view_size).field_0 = aVar7;
  aVar1.data[1] = (float)aiStack_34[0] * 0.5;
  aVar1.data[0] = (float)local_38 * 0.5;
  (this->m_view_center).field_0 = aVar1;
  GVar3 = (*glad_glCreateProgram)();
  this->m_program = GVar3;
  GVar3 = anon_unknown_0::compile_shader
                    ("\n      #version 100\n\n      attribute vec2 a_position;\n      attribute vec4 a_color;\n\n      varying vec4 v_color;\n\n      uniform mat3 u_transform;\n\n      void main(void) {\n        v_color = a_color;\n\n        vec3 worldPosition = vec3(a_position, 1);\n        vec3 normalizedPosition = worldPosition * u_transform;\n\n        gl_Position = vec4(normalizedPosition.xy, 0, 1);\n      }\n    "
                     ,0x8b31);
  (*glad_glAttachShader)(this->m_program,GVar3);
  (*glad_glDeleteShader)(GVar3);
  GVar3 = anon_unknown_0::compile_shader
                    ("\n      #version 100\n\n      precision mediump float;\n\n      varying vec4 v_color;\n\n      void main(void) {\n        gl_FragColor = v_color;\n      }\n    "
                     ,0x8b30);
  (*glad_glAttachShader)(this->m_program,GVar3);
  (*glad_glDeleteShader)(GVar3);
  (*glad_glLinkProgram)(this->m_program);
  local_38 = 0;
  (*glad_glGetProgramiv)(this->m_program,0x8b82,&local_38);
  if (local_38 == 0) {
    (*glad_glGetProgramiv)(this->m_program,0x8b84,&local_2c);
    if ((long)local_2c < 1) {
      __assert_fail("info_log_length > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                    ,0x90,"hmi::renderer::renderer(SDL_Window *)");
    }
    pcVar5 = (char *)operator_new__((long)local_2c);
    (*glad_glGetProgramInfoLog)(this->m_program,local_2c,(GLsizei *)0x0,pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error while linking the program: ",0x21);
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    operator_delete__(pcVar5);
  }
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4000);
  return;
}

Assistant:

renderer::renderer(SDL_Window *window)
  : m_window(window)
  , m_context(nullptr)
  , m_program(0)
  {
    // create context

    m_context = SDL_GL_CreateContext(window);

    if (m_context == nullptr) {
      std::cerr << "Failed to create a context: " << SDL_GetError() << std::endl;
      return;
    }

    int err = SDL_GL_MakeCurrent(m_window, m_context);

    if (err != 0) {
      std::cerr << "Failed to make the context current: " << SDL_GetError() << std::endl;
    }

    // load GLES2 functions

    if (gladLoadGLES2Loader(SDL_GL_GetProcAddress) == 0) {
      std::cerr << "Failed to load GLES2" << std::endl;
    }

    glEnable(GL_BLEND);
    glBlendEquationSeparate(GL_FUNC_ADD, GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    // create view

    m_view_size = get_size();
    m_view_center = m_view_size / 2.0f;

    // create shader

    m_program = glCreateProgram();

    GLuint vertex_shader_id = compile_shader(g_vertex_shader, GL_VERTEX_SHADER);
    glAttachShader(m_program, vertex_shader_id);
    glDeleteShader(vertex_shader_id); // the shader is still here because it is attached to the program

    GLuint fragment_shader_id = compile_shader(g_fragment_shader, GL_FRAGMENT_SHADER);
    glAttachShader(m_program, fragment_shader_id);
    glDeleteShader(fragment_shader_id); // the shader is still here because it is attached to the program

    glLinkProgram(m_program);

    GLint link_status = GL_FALSE;
    glGetProgramiv(m_program, GL_LINK_STATUS, &link_status);

    if (link_status == GL_FALSE) {
      GLint info_log_length;
      glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &info_log_length);

      assert(info_log_length > 0);
      std::unique_ptr<char[]> info_log(new char[info_log_length]);
      glGetProgramInfoLog(m_program, info_log_length, nullptr, info_log.get());

      std::cerr << "Error while linking the program: " << info_log.get() << std::endl;
    }

    // initialize the screen

    clear(color::black);
  }